

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onconnect.c
# Opt level: O2

int handle_signal(void)

{
  uint uVar1;
  ssize_t sVar2;
  int es;
  signalfd_siginfo info;
  
  sVar2 = read(cfg.signal_fd,&info,0x80);
  if (sVar2 == 0x80) {
    if (info.ssi_signo == 0xe) {
      cfg.ticks = cfg.ticks + 1;
      if (cfg.ticks % 10 == 0) {
        periodic();
      }
      alarm(1);
      return 0;
    }
    if (info.ssi_signo == 0x11) {
      while (uVar1 = waitpid(-1,&es,1), 0 < (int)uVar1) {
        if (0x1ffffff < (int)((es & 0x7fU) * 0x1000000 + 0x1000000)) {
          fprintf(_stderr,"pid %d exited: signal %d\n",(ulong)uVar1);
        }
        if ((es & 0x7fU) == 0) {
          fprintf(_stderr,"pid %d exited: status %d\n",(ulong)uVar1,(ulong)((uint)es >> 8 & 0xff));
        }
      }
      return 0;
    }
    fprintf(_stderr,"got signal %d\n");
  }
  else {
    fwrite("failed to read signal fd buffer\n",0x20,1,_stderr);
  }
  return -1;
}

Assistant:

int handle_signal() {
  struct signalfd_siginfo info;
  int es, rc = -1;
  pid_t pid;

  if (read(cfg.signal_fd, &info, sizeof(info)) != sizeof(info)) {
    fprintf(stderr,"failed to read signal fd buffer\n");
    goto done;
  }

  switch (info.ssi_signo) {
    case SIGALRM: 
      if ((++cfg.ticks % 10) == 0) periodic(); 
      alarm(1); 
      break;
    case SIGCHLD:  /* collect children to avoid leaving zombie processes */
      while ( (pid = waitpid(-1, &es, WNOHANG)) > 0) {
        if (WIFSIGNALED(es)) {
          fprintf(stderr, "pid %d exited: signal %d\n", pid, (int)WTERMSIG(es));
        }
        if (WIFEXITED(es)) {
          fprintf(stderr, "pid %d exited: status %d\n", pid, (int)WEXITSTATUS(es));
        }
      }
      break;
    default:  /* exit */
      /* TODO on termination, signal forked processes */
      fprintf(stderr,"got signal %d\n", info.ssi_signo);  
      goto done;
  }

  rc = 0;

 done:
  return rc;
}